

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

void __thiscall Image::Image(Image *this,uint width,uint height)

{
  allocator_type local_32;
  value_type local_31;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  (this->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->pixels = (Pixel *)0x0;
  (this->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->width = width;
  this->height = height;
  this->colors = 4;
  this->error_threshold = 1.0;
  local_31 = 0xff;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30,
             (ulong)(width * height * 4),&local_31,&local_32);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(&this->raw,&local_30);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  this->pixels = (Pixel *)(this->raw).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
  return;
}

Assistant:

Image::Image(unsigned int width, unsigned int height) : width(width), height(height) {
  // Zero-initialize the image.
  raw = std::vector<unsigned char>(width * height * 4, 255);
  // Set the pixel pointer to the start of the raw buffer
  pixels = reinterpret_cast<Pixel *>(raw.data());
}